

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k_ary_search_set.hpp
# Opt level: O1

void __thiscall
burst::k_ary_search_set<int,std::less<void>>::
k_ary_search_set<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
          (k_ary_search_set<int,std::less<void>> *this,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last,size_t arity,
          value_compare *compare)

{
  iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
  local_20;
  
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(size_t *)(this + 0x18) = arity;
  local_20.
  super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::random_access_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::bidirectional_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::incrementable_traversal_tag>
  .m_Begin._M_current = first._M_current;
  local_20.
  super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::random_access_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::bidirectional_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::incrementable_traversal_tag>
  .m_End._M_current = last._M_current;
  initialize<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>>
            (this,&local_20);
  return;
}

Assistant:

k_ary_search_set
                (
                    RandomAccessIterator first,
                    RandomAccessIterator last,
                    std::size_t arity = default_arity,
                    const value_compare & compare = value_compare()
                ):
            m_arity(arity),
            m_compare(compare)
        {
            initialize(boost::make_iterator_range(first, last));
        }